

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

bool __thiscall cppcms::widgets::file::validate(file *this)

{
  uint *puVar1;
  long lVar2;
  pointer pcVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong *puVar9;
  istream *piVar10;
  long lVar11;
  _func_int *p_Var12;
  ulong uVar13;
  bool bVar14;
  vector<char,_std::allocator<char>_> buf;
  string magic;
  allocator_type local_b9;
  vector<char,_std::allocator<char>_> local_b8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  string local_80;
  string local_60;
  string local_40;
  
  p_Var12 = (this->super_base_html_input)._vptr_base_html_input[-3];
  uVar7 = *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var12);
  if ((uVar7 & 2) == 0) {
    if (((this->super_base_html_input).field_0x80 & 2) == 0) {
      *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var12) = uVar7 | 1;
      return true;
    }
    uVar7 = uVar7 & 0xfffffffc;
LAB_001fbeca:
    *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var12) = uVar7;
  }
  else {
    if ((uVar7 & 1) == 0) {
      return false;
    }
    if (((*(int *)&(this->super_base_html_input).field_0x34 == -1) &&
        (*(int *)&(this->super_base_html_input).field_0x30 == -1)) ||
       ((uVar8 = http::file::size(*(file **)&(this->super_base_html_input).field_0x88),
        uVar8 <= (ulong)(long)*(int *)&(this->super_base_html_input).field_0x34 &&
        (uVar13 = (ulong)*(int *)&(this->super_base_html_input).field_0x30,
        uVar13 <= uVar8 || uVar13 == 0xffffffffffffffff)))) {
      lVar11 = *(long *)&(this->super_base_html_input).field_0x58;
      if (lVar11 == 0) {
LAB_001fbf0d:
        bVar14 = false;
      }
      else {
        http::file::mime_abi_cxx11_(&local_40,*(file **)&(this->super_base_html_input).field_0x88);
        bVar14 = true;
        if (local_40._M_string_length == *(size_t *)&(this->super_base_html_input).field_0x58) {
          if (local_40._M_string_length == 0) goto LAB_001fbf0d;
          iVar6 = bcmp(local_40._M_dataplus._M_p,*(void **)&(this->super_base_html_input).field_0x50
                       ,local_40._M_string_length);
          bVar14 = iVar6 != 0;
        }
      }
      if ((lVar11 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2)) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (!bVar14) {
        cVar4 = booster::regex::empty();
        if (cVar4 == '\0') {
          http::file::mime_abi_cxx11_(&local_60,*(file **)&(this->super_base_html_input).field_0x88)
          ;
          bVar5 = booster::regex::match
                            (&(this->super_base_html_input).field_0x70,local_60._M_dataplus._M_p,
                             (int)local_60._M_string_length + (int)local_60._M_dataplus._M_p);
          bVar5 = bVar5 ^ 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
        }
        else {
          bVar5 = 0;
        }
        if (bVar5 == 0) {
          cVar4 = booster::regex::empty();
          if (cVar4 == '\0') {
            http::file::filename_abi_cxx11_
                      (&local_80,*(file **)&(this->super_base_html_input).field_0x88);
            bVar5 = booster::regex::match
                              (&(this->super_base_html_input).field_0x78,local_80._M_dataplus._M_p,
                               (int)local_80._M_string_length + (int)local_80._M_dataplus._M_p);
            bVar5 = bVar5 ^ 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p);
            }
          }
          else {
            bVar5 = 0;
          }
          p_Var12 = (this->super_base_html_input)._vptr_base_html_input[-3];
          uVar7 = *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var12);
          if (bVar5 == 0) {
            if ((uVar7 & 1) != 0) {
              lVar11 = *(long *)&(this->super_base_html_input).field_0x38;
              lVar2 = *(long *)&(this->super_base_html_input).field_0x40;
              if (lVar11 != lVar2) {
                puVar9 = (ulong *)(lVar11 + 8);
                uVar7 = 1;
                uVar8 = 0;
                do {
                  if (uVar8 < *puVar9) {
                    uVar8 = *puVar9;
                  }
                  uVar13 = (ulong)uVar7;
                  puVar9 = puVar9 + 4;
                  uVar7 = uVar7 + 1;
                } while (uVar13 < (ulong)(lVar2 - lVar11 >> 5));
                local_a0[0] = (undefined1 *)((ulong)local_a0[0] & 0xffffffffffffff00);
                std::vector<char,_std::allocator<char>_>::vector
                          (&local_b8,uVar8 + 1,(value_type_conflict *)local_a0,&local_b9);
                piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
                std::istream::seekg(piVar10,0,0);
                piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
                std::istream::read((char *)piVar10,
                                   (long)local_b8.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
                pcVar3 = local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
                local_a0[0] = local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,pcVar3,pcVar3 + *(long *)(piVar10 + 8));
                piVar10 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
                std::istream::seekg(piVar10,0,0);
                puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                                 (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
                *puVar1 = *puVar1 & 0xfffffffe;
                lVar11 = *(long *)&(this->super_base_html_input).field_0x38;
                if (*(long *)&(this->super_base_html_input).field_0x40 != lVar11) {
                  uVar8 = 0;
                  uVar13 = 1;
                  do {
                    iVar6 = std::__cxx11::string::compare
                                      ((ulong)local_a0,0,*(string **)(lVar11 + 8 + uVar8 * 0x20));
                    if (iVar6 == 0) {
                      puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                                       (long)(this->super_base_html_input)._vptr_base_html_input[-3]
                                       );
                      *puVar1 = *puVar1 | 1;
                      break;
                    }
                    lVar11 = *(long *)&(this->super_base_html_input).field_0x38;
                    bVar14 = uVar13 < (ulong)(*(long *)&(this->super_base_html_input).field_0x40 -
                                              lVar11 >> 5);
                    uVar8 = uVar13;
                    uVar13 = (ulong)((int)uVar13 + 1);
                  } while (bVar14);
                }
                if (local_a0[0] != local_90) {
                  operator_delete(local_a0[0]);
                }
                if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
              }
            }
            return (bool)((&(this->super_base_html_input).field_0x1f0)
                          [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 1);
          }
          uVar7 = uVar7 & 0xfffffffe;
          goto LAB_001fbeca;
        }
      }
    }
    puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                     (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  return false;
}

Assistant:

bool file::validate()
{
	if(!set()) {
		if(check_non_empty_) {
			valid(false);
			return false;
		}
		else {
			valid(true);
			return true;
		}
	}
	if(!valid())
		return false;
	if(size_max_ != -1 || size_min_!= -1) {
		size_t file_size = file_->size();
		if(size_max_ != -1 && file_size > size_t(size_max_)) {
			valid(false);
			return false;
		}
		if(size_min_ != -1 && file_size < size_t(size_min_)) {
			valid(false);
			return false;
		}
	}
	if(!mime_string_.empty() && file_->mime()!=mime_string_) {
		valid(false);
		return false;
	}
	if(!mime_regex_.empty() && !booster::regex_match(file_->mime(),mime_regex_)){
		valid(false);
		return false;
	}
	if(!filename_regex_.empty() && !booster::regex_match(file_->filename(),filename_regex_)){
		valid(false);
		return false;
	}
	if(valid() && !magics_.empty()) {
		size_t size_max = 0;
		for(unsigned i=0;i<magics_.size();i++)
			size_max=std::max(magics_[i].size(),size_max);
		std::vector<char> buf(size_max+1,0);
		file_->data().seekg(0);
		file_->data().read(&buf.front(),size_max);
		std::string magic(&buf.front(),file_->data().gcount());
		file_->data().seekg(0);
		valid(false);
		for(unsigned i=0;i<magics_.size();i++) {
			if(magic.compare(0,magics_[i].size(),magics_[i])==0) {
				valid(true);
				break;
			}
		}
	}
	return valid();

}